

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

Result<fs::path> * wallet::GetWalletPath(Result<fs::path> *__return_storage_ptr__,string *name)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  int iVar4;
  path *__p;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_R8;
  long in_FS_OFFSET;
  path wallet_path;
  path local_180;
  string local_158;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  path local_f8;
  path local_d0;
  path local_a8;
  path local_80;
  path local_58;
  Result<fs::path> *local_30;
  
  local_30 = *(Result<fs::path> **)(in_FS_OFFSET + 0x28);
  GetWalletDir();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_58,name,auto_format);
  std::filesystem::__cxx11::path::path(&local_d0,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  fsbridge::AbsPathJoin((path *)&local_80,(path *)&local_a8,(path *)&local_d0);
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::filesystem::__cxx11::path::~path(&local_a8);
  bVar3 = std::filesystem::symlink_status(&local_80);
  if (bVar3 < 3) {
    if (bVar3 == 1) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_58,name,auto_format);
      std::filesystem::__cxx11::path::path(&local_d0,&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
      fs::path::filename((path *)&local_a8,(path *)&local_d0);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_58,name,auto_format);
      std::filesystem::__cxx11::path::path(&local_f8,&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
      iVar4 = std::filesystem::__cxx11::path::compare(&local_a8);
      std::filesystem::__cxx11::path::~path(&local_f8);
      std::filesystem::__cxx11::path::~path(&local_a8);
      std::filesystem::__cxx11::path::~path(&local_d0);
      if (iVar4 == 0) goto LAB_00167304;
    }
    else {
joined_r0x001672fe:
      if (bVar3 == 2) goto LAB_00167304;
    }
LAB_001673ec:
    GetWalletDir();
    paVar2 = &local_a8._M_pathname.field_2;
    local_a8._M_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,local_58._M_pathname._M_dataplus._M_p,
               local_58._M_pathname._M_dataplus._M_p + local_58._M_pathname._M_string_length);
    local_d0._M_pathname._M_string_length._0_2_ = 0x2622;
    local_d0._M_pathname._M_dataplus._M_p = (pointer)&local_a8;
    tinyformat::
    format<std::__cxx11::string,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
              (&local_158,
               (tinyformat *)
               "Invalid -wallet path \'%s\'. -wallet path should point to a directory where wallet.dat and database/log.?????????? files can be stored, a location where such a directory could be created, or (for backwards compatibility) the name of an existing data file in -walletdir (%s)"
               ,(char *)name,&local_d0._M_pathname,in_R8);
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_158._M_dataplus._M_p,
               local_158._M_dataplus._M_p + local_158._M_string_length);
    local_118 = &local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_158._M_dataplus._M_p,
               local_158._M_dataplus._M_p + local_158._M_string_length);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_fs::path>.
                     super__Move_assign_alias<bilingual_str,_fs::path>.
                     super__Copy_assign_alias<bilingual_str,_fs::path>.
                     super__Move_ctor_alias<bilingual_str,_fs::path>.
                     super__Copy_ctor_alias<bilingual_str,_fs::path>.
                     super__Variant_storage_alias<bilingual_str,_fs::path> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
      super__Move_assign_alias<bilingual_str,_fs::path>.
      super__Copy_assign_alias<bilingual_str,_fs::path>.
      super__Move_ctor_alias<bilingual_str,_fs::path>.
      super__Copy_ctor_alias<bilingual_str,_fs::path>.
      super__Variant_storage_alias<bilingual_str,_fs::path> = puVar1;
    if (local_138 == &local_128) {
      *puVar1 = CONCAT71(uStack_127,local_128);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
               super__Move_assign_alias<bilingual_str,_fs::path>.
               super__Copy_assign_alias<bilingual_str,_fs::path>.
               super__Move_ctor_alias<bilingual_str,_fs::path>.
               super__Copy_ctor_alias<bilingual_str,_fs::path>.
               super__Variant_storage_alias<bilingual_str,_fs::path> + 0x18) = uStack_120;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
        super__Move_assign_alias<bilingual_str,_fs::path>.
        super__Copy_assign_alias<bilingual_str,_fs::path>.
        super__Move_ctor_alias<bilingual_str,_fs::path>.
        super__Copy_ctor_alias<bilingual_str,_fs::path>.
        super__Variant_storage_alias<bilingual_str,_fs::path> = local_138;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_fs::path>.
                        super__Move_assign_alias<bilingual_str,_fs::path>.
                        super__Copy_assign_alias<bilingual_str,_fs::path>.
                        super__Move_ctor_alias<bilingual_str,_fs::path>.
                        super__Copy_ctor_alias<bilingual_str,_fs::path>.
                        super__Variant_storage_alias<bilingual_str,_fs::path> + 0x10) =
           CONCAT71(uStack_127,local_128);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
             super__Move_assign_alias<bilingual_str,_fs::path>.
             super__Copy_assign_alias<bilingual_str,_fs::path>.
             super__Move_ctor_alias<bilingual_str,_fs::path>.
             super__Copy_ctor_alias<bilingual_str,_fs::path>.
             super__Variant_storage_alias<bilingual_str,_fs::path> + 8) = local_130;
    local_130 = 0;
    local_128 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_fs::path>.
                     super__Move_assign_alias<bilingual_str,_fs::path>.
                     super__Copy_assign_alias<bilingual_str,_fs::path>.
                     super__Move_ctor_alias<bilingual_str,_fs::path>.
                     super__Copy_ctor_alias<bilingual_str,_fs::path>.
                     super__Variant_storage_alias<bilingual_str,_fs::path> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
             super__Move_assign_alias<bilingual_str,_fs::path>.
             super__Copy_assign_alias<bilingual_str,_fs::path>.
             super__Move_ctor_alias<bilingual_str,_fs::path>.
             super__Copy_ctor_alias<bilingual_str,_fs::path>.
             super__Variant_storage_alias<bilingual_str,_fs::path> + 0x20) = puVar1;
    if (local_118 == &local_108) {
      *puVar1 = CONCAT71(uStack_107,local_108);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
               super__Move_assign_alias<bilingual_str,_fs::path>.
               super__Copy_assign_alias<bilingual_str,_fs::path>.
               super__Move_ctor_alias<bilingual_str,_fs::path>.
               super__Copy_ctor_alias<bilingual_str,_fs::path>.
               super__Variant_storage_alias<bilingual_str,_fs::path> + 0x38) = uStack_100;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
               super__Move_assign_alias<bilingual_str,_fs::path>.
               super__Copy_assign_alias<bilingual_str,_fs::path>.
               super__Move_ctor_alias<bilingual_str,_fs::path>.
               super__Copy_ctor_alias<bilingual_str,_fs::path>.
               super__Variant_storage_alias<bilingual_str,_fs::path> + 0x20) = local_118;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_fs::path>.
                        super__Move_assign_alias<bilingual_str,_fs::path>.
                        super__Copy_assign_alias<bilingual_str,_fs::path>.
                        super__Move_ctor_alias<bilingual_str,_fs::path>.
                        super__Copy_ctor_alias<bilingual_str,_fs::path>.
                        super__Variant_storage_alias<bilingual_str,_fs::path> + 0x30) =
           CONCAT71(uStack_107,local_108);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
             super__Move_assign_alias<bilingual_str,_fs::path>.
             super__Copy_assign_alias<bilingual_str,_fs::path>.
             super__Move_ctor_alias<bilingual_str,_fs::path>.
             super__Copy_ctor_alias<bilingual_str,_fs::path>.
             super__Variant_storage_alias<bilingual_str,_fs::path> + 0x28) = local_110;
    local_110 = 0;
    local_108 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
             super__Move_assign_alias<bilingual_str,_fs::path>.
             super__Copy_assign_alias<bilingual_str,_fs::path>.
             super__Move_ctor_alias<bilingual_str,_fs::path>.
             super__Copy_ctor_alias<bilingual_str,_fs::path>.
             super__Variant_storage_alias<bilingual_str,_fs::path> + 0x40) = '\0';
    local_138 = &local_128;
    local_118 = &local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                      local_a8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    __p = &local_58;
  }
  else {
    if (bVar3 != 0xff) {
      if (bVar3 != 3) goto LAB_001673ec;
      bVar3 = std::filesystem::status(&local_80);
      goto joined_r0x001672fe;
    }
LAB_00167304:
    std::filesystem::__cxx11::path::path(&local_180,&local_80);
    __p = &local_180;
    std::filesystem::__cxx11::path::path((path *)__return_storage_ptr__,__p);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_fs::path>.
             super__Move_assign_alias<bilingual_str,_fs::path>.
             super__Copy_assign_alias<bilingual_str,_fs::path>.
             super__Move_ctor_alias<bilingual_str,_fs::path>.
             super__Copy_ctor_alias<bilingual_str,_fs::path>.
             super__Variant_storage_alias<bilingual_str,_fs::path> + 0x40) = '\x01';
  }
  std::filesystem::__cxx11::path::~path(__p);
  std::filesystem::__cxx11::path::~path(&local_80);
  if (*(Result<fs::path> **)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return *(Result<fs::path> **)(in_FS_OFFSET + 0x28);
}

Assistant:

static util::Result<fs::path> GetWalletPath(const std::string& name)
{
    // Do some checking on wallet path. It should be either a:
    //
    // 1. Path where a directory can be created.
    // 2. Path to an existing directory.
    // 3. Path to a symlink to a directory.
    // 4. For backwards compatibility, the name of a data file in -walletdir.
    const fs::path wallet_path = fsbridge::AbsPathJoin(GetWalletDir(), fs::PathFromString(name));
    fs::file_type path_type = fs::symlink_status(wallet_path).type();
    if (!(path_type == fs::file_type::not_found || path_type == fs::file_type::directory ||
          (path_type == fs::file_type::symlink && fs::is_directory(wallet_path)) ||
          (path_type == fs::file_type::regular && fs::PathFromString(name).filename() == fs::PathFromString(name)))) {
        return util::Error{Untranslated(strprintf(
              "Invalid -wallet path '%s'. -wallet path should point to a directory where wallet.dat and "
              "database/log.?????????? files can be stored, a location where such a directory could be created, "
              "or (for backwards compatibility) the name of an existing data file in -walletdir (%s)",
              name, fs::quoted(fs::PathToString(GetWalletDir()))))};
    }
    return wallet_path;
}